

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

TStatus luaD_pcall(lua_State *L,Pfunc func,void *u,ptrdiff_t old_top,ptrdiff_t ef)

{
  lu_byte lVar1;
  CallInfo *pCVar2;
  ptrdiff_t pVar3;
  TString *pTVar4;
  long lVar5;
  TStatus TVar6;
  byte bVar7;
  TValue *io;
  long *plVar8;
  
  pCVar2 = L->ci;
  lVar1 = L->allowhook;
  pVar3 = L->errfunc;
  L->errfunc = ef;
  TVar6 = luaD_rawrunprotected(L,func,u);
  if (TVar6 == '\0') {
    TVar6 = '\0';
  }
  else {
    L->ci = pCVar2;
    L->allowhook = lVar1;
    TVar6 = luaD_closeprotected(L,old_top,TVar6);
    plVar8 = (long *)(old_top + (long)(L->stack).p);
    if (TVar6 == '\x04') {
      pTVar4 = L->l_G->memerrmsg;
      *plVar8 = (long)pTVar4;
      bVar7 = pTVar4->tt | 0x40;
    }
    else {
      lVar5 = (L->top).offset;
      *plVar8 = *(long *)(lVar5 + -0x10);
      bVar7 = *(byte *)(lVar5 + -8);
    }
    *(byte *)(plVar8 + 1) = bVar7;
    (L->top).p = (StkId)(plVar8 + 2);
    luaD_shrinkstack(L);
  }
  L->errfunc = pVar3;
  return TVar6;
}

Assistant:

TStatus luaD_pcall (lua_State *L, Pfunc func, void *u, ptrdiff_t old_top,
                                  ptrdiff_t ef) {
  TStatus status;
  CallInfo *old_ci = L->ci;
  lu_byte old_allowhooks = L->allowhook;
  ptrdiff_t old_errfunc = L->errfunc;
  L->errfunc = ef;
  status = luaD_rawrunprotected(L, func, u);
  if (l_unlikely(status != LUA_OK)) {  /* an error occurred? */
    L->ci = old_ci;
    L->allowhook = old_allowhooks;
    status = luaD_closeprotected(L, old_top, status);
    luaD_seterrorobj(L, status, restorestack(L, old_top));
    luaD_shrinkstack(L);   /* restore stack size in case of overflow */
  }
  L->errfunc = old_errfunc;
  return status;
}